

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitTryTable(BinaryInstWriter *this,TryTable *curr)

{
  BufferWithRandomAccess *pBVar1;
  WasmBinaryWriter *this_00;
  bool bVar2;
  uint32_t value;
  uint value_00;
  size_t sVar3;
  ulong uVar4;
  IString *this_01;
  bool *pbVar5;
  Name *pNVar6;
  int8_t local_91;
  U32LEB local_44;
  size_t local_40;
  char *local_38;
  U32LEB local_2c;
  uint local_28;
  U32LEB local_24;
  Index i;
  TryTable *local_18;
  TryTable *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (TryTable *)this;
  BufferWithRandomAccess::operator<<(this->o,'\x1f');
  _i = (local_18->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id;
  emitResultType(this,_i);
  pBVar1 = this->o;
  sVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                    (&(local_18->catchTags).
                      super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_24,(uint)sVar3);
  BufferWithRandomAccess::operator<<(pBVar1,local_24);
  for (local_28 = 0; uVar4 = (ulong)local_28,
      sVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(local_18->catchTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>), uVar4 < sVar3
      ; local_28 = local_28 + 1) {
    this_01 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(local_18->catchTags).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (ulong)local_28)->super_IString;
    bVar2 = IString::operator_cast_to_bool(this_01);
    if (bVar2) {
      pBVar1 = this->o;
      pbVar5 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                         (&(local_18->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,
                          (ulong)local_28);
      BufferWithRandomAccess::operator<<(pBVar1,(*pbVar5 & 1U) != 0);
      pBVar1 = this->o;
      this_00 = this->parent;
      pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(local_18->catchTags).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (ulong)local_28);
      local_40 = (pNVar6->super_IString).str._M_len;
      local_38 = (pNVar6->super_IString).str._M_str;
      value = WasmBinaryWriter::getTagIndex(this_00,(Name)(pNVar6->super_IString).str);
      LEB<unsigned_int,_unsigned_char>::LEB(&local_2c,value);
      BufferWithRandomAccess::operator<<(pBVar1,local_2c);
    }
    else {
      pBVar1 = this->o;
      pbVar5 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                         (&(local_18->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,
                          (ulong)local_28);
      local_91 = '\x03';
      if ((*pbVar5 & 1U) == 0) {
        local_91 = '\x02';
      }
      BufferWithRandomAccess::operator<<(pBVar1,local_91);
    }
    pBVar1 = this->o;
    pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(local_18->catchDests).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)local_28)
    ;
    value_00 = getBreakIndex(this,(Name)(pNVar6->super_IString).str);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_44,value_00);
    BufferWithRandomAccess::operator<<(pBVar1,local_44);
  }
  std::vector<wasm::Name,std::allocator<wasm::Name>>::emplace_back<wasm::Name&>
            ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->breakStack,
             (Name *)IMPOSSIBLE_CONTINUE);
  return;
}

Assistant:

void BinaryInstWriter::visitTryTable(TryTable* curr) {
  o << int8_t(BinaryConsts::TryTable);
  emitResultType(curr->type);
  o << U32LEB(curr->catchTags.size());
  for (Index i = 0; i < curr->catchTags.size(); i++) {
    if (curr->catchTags[i]) {
      o << (curr->catchRefs[i] ? int8_t(BinaryConsts::CatchRef)
                               : int8_t(BinaryConsts::Catch));
      o << U32LEB(parent.getTagIndex(curr->catchTags[i]));
    } else {
      o << (curr->catchRefs[i] ? int8_t(BinaryConsts::CatchAllRef)
                               : int8_t(BinaryConsts::CatchAll));
    }
    o << U32LEB(getBreakIndex(curr->catchDests[i]));
  }
  // the binary format requires this; we have a block if we need one
  // catch_*** clauses should refer to block labels without entering the try
  // scope. So we do this at the end.
  breakStack.emplace_back(IMPOSSIBLE_CONTINUE);
}